

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_base.c
# Opt level: O0

int lj_cf_load(lua_State *L)

{
  int iVar1;
  ulong uVar2;
  GCstr *pGVar3;
  GCstr *local_98;
  GCstr *local_88;
  GCstr *local_78;
  GCstr *local_68;
  GCstr *str;
  SBufExt *sbx;
  GCstr *pGStack_30;
  MSize len;
  char *s;
  int status;
  GCstr *mode;
  GCstr *name;
  lua_State *L_local;
  
  mode = lj_lib_optstr(L,2);
  local_78 = lj_lib_optstr(L,3);
  if ((L->base < L->top) &&
     ((((int)(L->base->field_4).it >> 0xf == -5 ||
       ((uint)((int)(L->base->field_4).it >> 0xf) < 0xfffffff3)) ||
      (((int)(L->base->field_4).it >> 0xf == -0xd &&
       (*(char *)((L->base->u64 & 0x7fffffffffff) + 10) == '\x03')))))) {
    if (((int)(L->base->field_4).it >> 0xf == -0xd) &&
       (*(char *)((L->base->u64 & 0x7fffffffffff) + 10) == '\x03')) {
      uVar2 = L->base->u64 & 0x7fffffffffff;
      pGStack_30 = *(GCstr **)(uVar2 + 0x58);
      sbx._4_4_ = (int)*(undefined8 *)(uVar2 + 0x30) - (int)*(undefined8 *)(uVar2 + 0x58);
      if (mode == (GCstr *)0x0) {
        mode = (GCstr *)((L->glref).ptr64 + 0x78);
      }
    }
    else {
      pGVar3 = lj_lib_checkstr(L,1);
      pGStack_30 = pGVar3 + 1;
      sbx._4_4_ = pGVar3->len;
    }
    lua_settop(L,4);
    if (mode == (GCstr *)0x0) {
      local_68 = pGStack_30;
    }
    else {
      local_68 = mode + 1;
    }
    if (local_78 == (GCstr *)0x0) {
      local_78 = (GCstr *)0x0;
    }
    else {
      local_78 = local_78 + 1;
    }
    s._4_4_ = luaL_loadbufferx(L,(char *)pGStack_30,(ulong)sbx._4_4_,(char *)local_68,
                               (char *)local_78);
  }
  else {
    lj_lib_checkfunc(L,1);
    lua_settop(L,5);
    if (mode == (GCstr *)0x0) {
      local_88 = (GCstr *)0x1c1e55;
    }
    else {
      local_88 = mode + 1;
    }
    if (local_78 == (GCstr *)0x0) {
      local_98 = (GCstr *)0x0;
    }
    else {
      local_98 = local_78 + 1;
    }
    s._4_4_ = lua_loadx(L,reader_func,(void *)0x0,(char *)local_88,(char *)local_98);
  }
  iVar1 = load_aux(L,s._4_4_,4);
  return iVar1;
}

Assistant:

LJLIB_CF(load)
{
  GCstr *name = lj_lib_optstr(L, 2);
  GCstr *mode = lj_lib_optstr(L, 3);
  int status;
  if (L->base < L->top &&
      (tvisstr(L->base) || tvisnumber(L->base) || tvisbuf(L->base))) {
    const char *s;
    MSize len;
    if (tvisbuf(L->base)) {
      SBufExt *sbx = bufV(L->base);
      s = sbx->r;
      len = sbufxlen(sbx);
      if (!name) name = &G(L)->strempty;  /* Buffers are not NUL-terminated. */
    } else {
      GCstr *str = lj_lib_checkstr(L, 1);
      s = strdata(str);
      len = str->len;
    }
    lua_settop(L, 4);  /* Ensure env arg exists. */
    status = luaL_loadbufferx(L, s, len, name ? strdata(name) : s,
			      mode ? strdata(mode) : NULL);
  } else {
    lj_lib_checkfunc(L, 1);
    lua_settop(L, 5);  /* Reserve a slot for the string from the reader. */
    status = lua_loadx(L, reader_func, NULL, name ? strdata(name) : "=(load)",
		       mode ? strdata(mode) : NULL);
  }
  return load_aux(L, status, 4);
}